

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.cc
# Opt level: O3

uint64_t __thiscall google::protobuf::internal::ThreadSafeArena::SpaceUsed(ThreadSafeArena *this)

{
  long lVar1;
  long lVar2;
  char *pcVar3;
  uint64_t uVar4;
  uint64_t uVar5;
  
  uVar5 = 0;
  for (lVar1 = *(long *)(this + 0x10); lVar1 != 0; lVar1 = *(long *)(lVar1 + 0x10)) {
    lVar2 = *(long *)(lVar1 + 0x28);
    pcVar3 = SerialArena::Block::Pointer(*(Block **)(lVar1 + 8),0x18);
    uVar5 = (((uVar5 + lVar2) - (long)pcVar3) + *(long *)(lVar1 + 0x18)) - 0x38;
  }
  uVar4 = uVar5 - 0x28;
  if (*(ulong *)(this + 8) < 8) {
    uVar4 = uVar5;
  }
  return uVar4;
}

Assistant:

uint64_t ThreadSafeArena::SpaceUsed() const {
  SerialArena* serial = threads_.load(std::memory_order_acquire);
  uint64_t space_used = 0;
  for (; serial; serial = serial->next()) {
    space_used += serial->SpaceUsed();
  }
  return space_used - (alloc_policy_.get() ? sizeof(AllocationPolicy) : 0);
}